

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  GetterXsYs<unsigned_int> *pGVar7;
  GetterXsYs<unsigned_int> *pGVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  ImVec2 IVar11;
  double dVar12;
  ImVec2 IVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  double dVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pGVar7 = this->Getter1;
  pGVar8 = this->Getter2;
  iVar5 = pGVar7->Count;
  lVar15 = (long)(((pGVar7->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  iVar5 = this->Transformer->YAxis;
  dVar17 = (double)GImPlot->PixelRange[iVar5].Min.x;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar16 = (float)(((double)*(uint *)((long)pGVar7->Xs + lVar15) - dVar3) * GImPlot->Mx + dVar17);
  dVar12 = (double)GImPlot->PixelRange[iVar5].Min.y;
  dVar4 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  fVar19 = (float)(((double)*(uint *)((long)pGVar7->Ys + lVar15) - dVar4) * GImPlot->My[iVar5] +
                  dVar12);
  iVar6 = pGVar8->Count;
  fVar20 = (this->P11).x;
  fVar24 = fVar20 - fVar16;
  lVar15 = (long)(((prim + 1 + pGVar8->Offset) % iVar6 + iVar6) % iVar6) * (long)pGVar8->Stride;
  IVar18.x = (float)(((double)*(uint *)((long)pGVar8->Xs + lVar15) - dVar3) * GImPlot->Mx + dVar17);
  fVar22 = (float)(((double)*(uint *)((long)pGVar8->Ys + lVar15) - dVar4) * GImPlot->My[iVar5] +
                  dVar12);
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar23 = (this->P12).x;
  fVar21 = fVar23 - IVar18.x;
  IVar18.y = fVar22;
  fVar25 = fVar20 * fVar19 - fVar16 * fVar1;
  fVar20 = fVar23 * fVar22 - IVar18.x * fVar2;
  fVar23 = fVar24 * (fVar2 - fVar22) - fVar21 * (fVar1 - fVar19);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9->col = this->Col;
  IVar11.y = fVar19;
  IVar11.x = fVar16;
  pIVar9[1].pos = IVar11;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[1].col = this->Col;
  IVar13.y = ((fVar2 - fVar22) * fVar25 - (fVar1 - fVar19) * fVar20) / fVar23;
  IVar13.x = (fVar25 * fVar21 - fVar24 * fVar20) / fVar23;
  pIVar9[2].pos = IVar13;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[2].col = this->Col;
  pIVar9[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[3].col = this->Col;
  pIVar9[4].pos = IVar18;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar9 = DrawList->_VtxWritePtr;
  pIVar9[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar9 + 5;
  puVar10 = DrawList->_IdxWritePtr;
  *puVar10 = DrawList->_VtxCurrentIdx;
  uVar14 = -(uint)(fVar2 < fVar1 && fVar19 < fVar22 || fVar22 < fVar19 && fVar1 < fVar2) & 1;
  puVar10[1] = DrawList->_VtxCurrentIdx + uVar14 + 1;
  puVar10[2] = DrawList->_VtxCurrentIdx + 3;
  puVar10[3] = DrawList->_VtxCurrentIdx + 1;
  puVar10[4] = (uVar14 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar10[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar10 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar16;
  (this->P11).y = fVar19;
  (this->P12).x = IVar18.x;
  (this->P12).y = fVar22;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }